

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     operate<andres::marray_detail::Assign<int,short>,int,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>,short>
               (View<int,_false,_std::allocator<unsigned_long>_> *v,
               BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
               *expression)

{
  long *plVar1;
  CoordinateOrder CVar2;
  View<short,_false,_std::allocator<unsigned_long>_> *this;
  pointer piVar3;
  pointer psVar4;
  pointer psVar5;
  long lVar6;
  unsigned_long uVar7;
  bool bVar8;
  size_t sVar9;
  size_t sVar10;
  runtime_error *prVar11;
  int *piVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  int *piVar18;
  pointer puVar19;
  ulong uVar20;
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator_type local_c1;
  long local_c0;
  long local_b8;
  View<short,_false,_std::allocator<unsigned_long>_> *local_b0;
  View<short,_false,_std::allocator<unsigned_long>_> *local_a8;
  View<int,_false,_std::allocator<unsigned_long>_> *local_a0;
  long local_98;
  reference local_90;
  reference local_88;
  size_t local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  long local_50;
  long local_48;
  
  if (((v->geometry_).size_ == 0) ||
     ((expression->e2_->geometry_).size_ == 0 && (expression->e1_->geometry_).size_ == 0)) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"Assertion failed.");
  }
  else {
    sVar9 = BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
            ::dimension(expression);
    if (v->data_ == (pointer)0x0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"Assertion failed.");
    }
    else if (sVar9 == (v->geometry_).dimension_) {
      if (sVar9 == 0) {
        if ((v->geometry_).size_ == 1) {
          uVar20 = (expression->e1_->geometry_).size_;
          uVar17 = (expression->e2_->geometry_).size_;
          if (uVar17 < uVar20) {
            uVar17 = uVar20;
          }
          if (uVar17 == 1) {
LAB_0021ed87:
            bVar8 = BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
                    ::overlaps<int,false,std::allocator<unsigned_long>>
                              ((BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
                                *)expression,v);
            if (bVar8) {
              Marray<int,std::allocator<unsigned_long>>::
              Marray<andres::BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>,short>
                        ((Marray<int,std::allocator<unsigned_long>> *)&local_78,
                         (ViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>,_short>
                          *)expression,&local_c1);
              operate<andres::marray_detail::Assign<int,short>,int,int,false,std::allocator<unsigned_long>>
                        (v,&local_78);
              operator_delete((void *)CONCAT44(local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_),
                              local_48 << 2);
              uVar20 = local_50 * 0x18;
              puVar19 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_0021f073:
              operator_delete(puVar19,uVar20);
              return;
            }
            if (v->data_ == (int *)0x0) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar11,"Assertion failed.");
            }
            else {
              if ((v->geometry_).dimension_ == 0) {
                *v->data_ = (int)(short)(*expression->e2_->data_ + *expression->e1_->data_);
                return;
              }
              View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
              if (((v->geometry_).isSimple_ == true) &&
                 (bVar8 = BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
                          ::isSimple(expression), bVar8)) {
                View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
                CVar2 = (v->geometry_).coordinateOrder_;
                this = expression->e1_;
                View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(this);
                if (CVar2 == (this->geometry_).coordinateOrder_) {
                  sVar9 = (v->geometry_).size_;
                  if (sVar9 != 0) {
                    piVar3 = v->data_;
                    psVar4 = expression->e1_->data_;
                    psVar5 = expression->e2_->data_;
                    sVar10 = 0;
                    do {
                      piVar3[sVar10] = (int)(short)(psVar5[sVar10] + psVar4[sVar10]);
                      sVar10 = sVar10 + 1;
                    } while (sVar9 != sVar10);
                    return;
                  }
                  return;
                }
              }
              local_a8 = expression->e1_;
              local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              local_88 = AccessOperatorHelper<true>::
                         execute<short,int,false,std::allocator<unsigned_long>>
                                   (local_a8,(int *)&local_78);
              local_b0 = expression->e2_;
              local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              local_90 = AccessOperatorHelper<true>::
                         execute<short,int,false,std::allocator<unsigned_long>>
                                   (local_b0,(int *)&local_78);
              if (v->data_ != (pointer)0x0) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          (&local_78,(v->geometry_).dimension_,(allocator_type *)&local_c1);
                piVar12 = v->data_;
                if (piVar12 == (int *)0x0) {
                  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar11,"Assertion failed.");
                  __cxa_throw(prVar11,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_80 = (v->geometry_).dimension_ - 1;
                local_98 = 0;
                local_b8 = 0;
                local_c0 = 0;
                piVar18 = piVar12;
                local_a0 = v;
                do {
                  *piVar12 = (int)(short)(local_90[local_b8] + local_88[local_c0]);
                  if ((v->geometry_).dimension_ != 0) {
                    sVar9 = 0;
                    do {
                      lVar6 = *(long *)(CONCAT44(local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       sVar9 * 8);
                      sVar10 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,sVar9);
                      v = local_a0;
                      if (lVar6 + 1U != sVar10) {
                        sVar10 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                           (local_a0,sVar9);
                        lVar6 = local_98;
                        sVar13 = View<short,_false,_std::allocator<unsigned_long>_>::strides
                                           (local_a8,sVar9);
                        sVar14 = View<short,_false,_std::allocator<unsigned_long>_>::strides
                                           (local_b0,sVar9);
                        local_c0 = local_c0 + sVar13;
                        local_b8 = local_b8 + sVar14;
                        local_98 = lVar6 + sVar10;
                        plVar1 = (long *)(CONCAT44(local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         sVar9 * 8);
                        *plVar1 = *plVar1 + 1;
                        piVar18 = v->data_;
                        break;
                      }
                      puVar19 = (pointer)CONCAT44(local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
                      if (local_80 == sVar9) {
                        if (puVar19 == (pointer)0x0) {
                          return;
                        }
                        uVar20 = (long)local_78.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar19;
                        goto LAB_0021f073;
                      }
                      uVar7 = puVar19[sVar9];
                      sVar10 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                         (local_a0,sVar9);
                      sVar13 = View<short,_false,_std::allocator<unsigned_long>_>::strides
                                         (local_a8,sVar9);
                      sVar14 = View<short,_false,_std::allocator<unsigned_long>_>::shape
                                         (local_a8,sVar9);
                      sVar15 = View<short,_false,_std::allocator<unsigned_long>_>::strides
                                         (local_b0,sVar9);
                      sVar16 = View<short,_false,_std::allocator<unsigned_long>_>::shape
                                         (local_b0,sVar9);
                      *(undefined8 *)
                       (CONCAT44(local_78.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_78.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_) + sVar9 * 8) = 0;
                      piVar18 = local_a0->data_;
                      if (piVar18 == (int *)0x0) {
                        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar11,"Assertion failed.");
                        __cxa_throw(prVar11,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      local_c0 = local_c0 - (sVar14 - 1) * sVar13;
                      local_b8 = local_b8 - (sVar16 - 1) * sVar15;
                      local_98 = local_98 - sVar10 * uVar7;
                      sVar9 = sVar9 + 1;
                      v = local_a0;
                    } while (sVar9 < (local_a0->geometry_).dimension_);
                  }
                  piVar12 = piVar18 + local_98;
                } while( true );
              }
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar11,"Assertion failed.");
            }
            goto LAB_0021f0c2;
          }
        }
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"Assertion failed.");
      }
      else {
        uVar20 = 0;
        do {
          if ((v->geometry_).dimension_ <= uVar20) goto LAB_0021ed87;
          sVar9 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,uVar20);
          sVar10 = BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
                   ::shape(expression,uVar20);
          if (sVar9 != sVar10) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Assertion failed.");
            goto LAB_0021f0c2;
          }
          uVar20 = uVar20 + 1;
        } while (v->data_ != (pointer)0x0);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"Assertion failed.");
      }
    }
    else {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"Assertion failed.");
    }
  }
LAB_0021f0c2:
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void operate
(
    View<T1, false, A>& v, 
    const ViewExpression<E, T2>& expression, 
    Functor f
)
{
    const E& e = expression; // cast
    if(!MARRAY_NO_DEBUG) {
        Assert(v.size() != 0 && e.size() != 0);
        Assert(e.dimension() == v.dimension());
        if(v.dimension() == 0) {
            Assert(v.size() == 1 && e.size() == 1);
        }
        else {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == e.shape(j));
            }
        }
    }
    if(e.overlaps(v)) {
        Marray<T1, A> m(e); // temporary copy
        operate(v, m, f);
    }
    else if(v.dimension() == 0) {
        f(v[0], e[0]);
    }
    else if(v.isSimple() && e.isSimple() 
    && v.coordinateOrder() == e.coordinateOrder()) {
        for(std::size_t j=0; j<v.size(); ++j) {
            f(v[j], e[j]);
        }
    }
    else {
        // loop unrolling does not improve performance here
        typename E::ExpressionIterator itE(e);
        std::size_t offsetV = 0;
        std::vector<std::size_t> coordinate(v.dimension());
        std::size_t maxDimension = v.dimension() - 1;
        for(;;) {
            f(v[offsetV], *itE);
            for(std::size_t j=0; j<v.dimension(); ++j) {
                if(coordinate[j]+1 == v.shape(j)) {
                    if(j == maxDimension) {
                        return;
                    }
                    else {
                        offsetV -= coordinate[j] * v.strides(j);
                        itE.resetCoordinate(j);
                        coordinate[j] = 0;
                    }
                }
                else {
                    offsetV += v.strides(j);
                    itE.incrementCoordinate(j);
                    ++coordinate[j];
                    break;
                }
            }
        }
    }
}